

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Maj3_ManAddCnf(Maj3_Man_t *p,int iMint)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int pLits [5];
  
  uVar7 = p->nVars;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar7) {
    uVar11 = (ulong)uVar7;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    p->ObjVals[uVar8] = (uint)(((uint)iMint >> ((uint)uVar8 & 0x1f) & 1) != 0);
  }
  if (p->ObjVals[0] == 0) {
    if (p->ObjVals[1] == 0) {
      uVar6 = 0;
      goto LAB_004a5d33;
    }
  }
  else if (p->ObjVals[1] != 0) {
    uVar6 = 1;
    goto LAB_004a5d33;
  }
  uVar6 = (uint)(p->ObjVals[2] != 0);
LAB_004a5d33:
  p->ObjVals[(int)uVar7] = uVar6;
  iVar3 = Maj3_ManValue(iMint,p->nVars);
  p->ObjVals[(long)p->nObjs + -1] = iVar3;
  for (lVar5 = (long)p->nVars + 0x40b; lVar5 + -0x40a < (long)p->nObjs + -1; lVar5 = lVar5 + 1) {
    iVar3 = p->iVar;
    p->iVar = iVar3 + 1;
    *(int *)((long)(p->VarMarks + -1) + 0x58 + lVar5 * 4) = iVar3;
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->iVar);
  uVar7 = 0;
  do {
    if (uVar7 == 2) {
      return 1;
    }
    uVar6 = uVar7 ^ 1;
    iVar3 = p->nObjs;
    piVar15 = p->VarMarks[(long)p->nVars + 1] + 1;
    lVar5 = (long)p->nVars;
    while( true ) {
      iVar10 = 1;
      if ((long)iVar3 <= lVar5 + 1) break;
      piVar16 = piVar15;
      piVar14 = p->ObjVals;
      for (lVar9 = 0; piVar14 = piVar14 + 1, lVar9 < iVar3; lVar9 = lVar9 + 1) {
        iVar4 = p->VarMarks[lVar5 + 1][lVar9];
        if ((0 < iVar4) && (uVar1 = p->ObjVals[lVar9], uVar1 != uVar6)) {
          bVar2 = 1 < (int)uVar1;
          if (bVar2) {
            pLits[0] = Abc_Var2Lit(uVar1,uVar7);
            iVar4 = p->VarMarks[lVar5 + 1][lVar9];
          }
          uVar8 = (ulong)bVar2;
          if (1 < iVar4) {
            iVar3 = Abc_Var2Lit(iVar4,1);
            uVar8 = (ulong)(bVar2 + 1);
            pLits[bVar2] = iVar3;
          }
          for (lVar12 = 0; iVar3 = p->nObjs, (int)lVar12 + iVar10 < iVar3; lVar12 = lVar12 + 1) {
            iVar3 = piVar16[lVar12];
            if ((0 < iVar3) && (uVar1 = piVar14[lVar12], uVar1 != uVar6)) {
              uVar11 = uVar8;
              if (1 < (int)uVar1) {
                iVar3 = Abc_Var2Lit(uVar1,uVar7);
                pLits[uVar8] = iVar3;
                iVar3 = piVar16[lVar12];
                uVar11 = (ulong)((int)uVar8 + 1);
              }
              uVar13 = uVar11;
              if (1 < iVar3) {
                iVar3 = Abc_Var2Lit(iVar3,1);
                uVar13 = (ulong)((int)uVar11 + 1);
                pLits[uVar11] = iVar3;
              }
              iVar3 = (int)uVar13;
              uVar1 = p->ObjVals[lVar5 + 1];
              if (uVar1 != uVar7) {
                if (1 < (int)uVar1) {
                  iVar4 = Abc_Var2Lit(uVar1,uVar6);
                  iVar3 = iVar3 + 1;
                  pLits[uVar13] = iVar4;
                }
                if (4 < iVar3 - 1U) {
                  __assert_fail("nLits2 > 0 && nLits2 <= 5",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                                ,0x16f,"int Maj3_ManAddCnf(Maj3_Man_t *, int)");
                }
                iVar3 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar3);
                if (iVar3 == 0) {
                  return 0;
                }
              }
            }
          }
        }
        piVar16 = piVar16 + 1;
        iVar10 = iVar10 + 1;
      }
      piVar15 = piVar15 + 0x20;
      lVar5 = lVar5 + 1;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int Maj3_ManAddCnf( Maj3_Man_t * p, int iMint )
{
    // input values
    int i, k, j, n, * pVals = p->ObjVals;
    for ( i = 0; i < p->nVars; i++ )
        pVals[i] = (iMint >> i) & 1;
    // first node value
    pVals[p->nVars] = (pVals[0] && pVals[1]) || (pVals[0] && pVals[2]) || (pVals[1] && pVals[2]);
    // last node value
    pVals[p->nObjs-1] = Maj3_ManValue(iMint, p->nVars);
    // intermediate node values
    for ( i = p->nVars + 1; i < p->nObjs - 1; i++ )
        pVals[i] = p->iVar++;
    //printf( "Adding clauses for minterm %d.\n", iMint );
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    for ( n = 0; n < 2; n++ )
    for ( i = p->nVars + 1; i < p->nObjs; i++ )
    {
        //printf( "\nNode %d. Phase %d.\n", i, n );
        for ( k = 0; k < p->nObjs; k++ ) if ( p->VarMarks[i][k] >= 1 )
        {
            // add first input
            int pLits[5], nLits = 0;
            if ( pVals[k] == !n )
                continue;
            if ( pVals[k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( pVals[k], n );
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 1 );
            for ( j = k+1; j < p->nObjs; j++ ) if ( p->VarMarks[i][j] >= 1 )
            {
                // add second input
                int nLits2 = nLits;
                if ( pVals[j] == !n )
                    continue;
                if ( pVals[j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[j], n );
                if ( p->VarMarks[i][j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( p->VarMarks[i][j], 1 );
                // add output
                if ( pVals[i] == n )
                    continue;
                if ( pVals[i] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[i], !n );
                assert( nLits2 > 0 && nLits2 <= 5 );
                //Maj3_PrintClause( pLits, nLits2 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits2 ) )
                    return 0;
            }
        }
    }
    return 1;
}